

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long in_RSI;
  int in_EDI;
  bool bVar4;
  size_t sz;
  char url [8192];
  urlq_getopt_t opts;
  int i;
  char **in_stack_ffffffffffffdf68;
  undefined8 in_stack_ffffffffffffdf70;
  int argc_00;
  urlq_getopt_t *in_stack_ffffffffffffdf80;
  char **in_stack_ffffffffffffdf88;
  urlq_handle_t p_Var5;
  char local_2058 [8192];
  undefined4 local_58;
  urlq_getopt_t local_48;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffdf70 >> 0x20);
  local_4 = 0;
  iVar1 = (int)&local_48;
  local_10 = in_RSI;
  local_8 = in_EDI;
  urlq_getopt::urlq_getopt((urlq_getopt *)0x106943);
  local_48.parent.dom_len = 0;
  local_48.parent._28_4_ = 0;
  local_48.handle = (urlq_handle_t)0x0;
  local_48.parent.val_len = 0;
  local_48.parent._12_4_ = 0;
  local_48.parent.dom_str = (char *)0x0;
  local_48._0_8_ = 0;
  local_48.parent.val_str = (char *)0x0;
  iVar1 = urlq_getopt_parse(iVar1,in_stack_ffffffffffffdf88,in_stack_ffffffffffffdf80);
  if (iVar1 != 0) {
    urlq_getopt_usage(argc_00,in_stack_ffffffffffffdf68);
    exit(1);
  }
  iVar1 = urlq_load(&local_48);
  if (iVar1 == 0) {
    for (local_14 = _optind; local_14 < local_8; local_14 = local_14 + 1) {
      pcVar3 = *(char **)(local_10 + (long)local_14 * 8);
      p_Var5 = local_48.handle;
      sVar2 = strlen(pcVar3);
      (*p_Var5)(pcVar3,sVar2,&local_48);
    }
    if (local_8 <= _optind) {
      while( true ) {
        iVar1 = feof(_stdin);
        bVar4 = false;
        if (iVar1 == 0) {
          iVar1 = ferror(_stdin);
          bVar4 = iVar1 == 0;
        }
        if ((!bVar4) || (pcVar3 = fgets(local_2058,0x2000,_stdin), pcVar3 == (char *)0x0)) break;
        pcVar3 = local_2058;
        sVar2 = strcspn(pcVar3,"\r\n");
        local_2058[sVar2] = '\0';
        (*local_48.handle)(pcVar3,sVar2,&local_48);
      }
    }
    local_4 = 0;
    local_58 = 1;
    urlq_getopt::~urlq_getopt((urlq_getopt *)0x106b7e);
    return local_4;
  }
  urlq_getopt_usage(argc_00,in_stack_ffffffffffffdf68);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    int i;

    urlq_getopt_t opts;
    std::memset(static_cast<void*>(&opts), 0, sizeof(opts));

    if (0 != urlq_getopt_parse(argc, argv, &opts))
    {
        urlq_getopt_usage(argc, argv);
        exit(EXIT_FAILURE);
    }

    if (0 != urlq_load(&opts))
    {
        urlq_getopt_usage(argc, argv);
        exit(EXIT_FAILURE);
    }

    for (i = optind; i < argc; ++i)
    {
        opts.handle(argv[i], strlen(argv[i]), &opts);
    }

    if (optind < argc)
    {
        return 0;
    }

    while (!feof(stdin) && !ferror(stdin))
    {
        char url [URLBUF];
        size_t sz;

        if (NULL == fgets(url, URLBUF, stdin))
        {
            break;
        }

        sz = strcspn(url, "\r\n");  /* optional */
        url[sz] = 0;                /* optional */

        opts.handle(url, sz, &opts);
    }

    return 0;
}